

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QStringList *strings,int type)

{
  QTreeWidgetItemPrivate *pQVar1;
  QTreeModel *pQVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_007ea768;
  this->rtti = type;
  (this->values).d.d = (Data *)0x0;
  (this->values).d.ptr = (QList<QWidgetItemData> *)0x0;
  (this->values).d.size = 0;
  this->view = (QTreeWidget *)0x0;
  pQVar1 = (QTreeWidgetItemPrivate *)operator_new(0x30);
  pQVar1->q = this;
  (pQVar1->display).d.d = (Data *)0x0;
  (pQVar1->display).d.ptr = (QVariant *)0x0;
  *(undefined8 *)((long)&(pQVar1->display).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(pQVar1->display).d.size + 1) = 0;
  pQVar1->rowGuess = -1;
  pQVar1->policy = DontShowIndicatorWhenChildless;
  this->d = pQVar1;
  this->par = (QTreeWidgetItem *)0x0;
  (this->children).d.d = (Data *)0x0;
  (this->children).d.ptr = (QTreeWidgetItem **)0x0;
  (this->children).d.size = 0;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x3d;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(strings->d).size; uVar4 = uVar4 + 1) {
    setText(this,(int)uVar4,(QString *)((long)&(((strings->d).ptr)->d).d + lVar3));
    lVar3 = lVar3 + 0x18;
  }
  pQVar2 = treeModel(this,treeview);
  if (pQVar2 != (QTreeModel *)0x0) {
    addChild(pQVar2->rootItem,this);
    QList<QList<QWidgetItemData>_>::reserve
              (&this->values,(long)(int)(pQVar2->headerItem->values).d.size);
    return;
  }
  return;
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, const QStringList &strings, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    for (int i = 0; i < strings.size(); ++i)
        setText(i, strings.at(i));
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        model->rootItem->addChild(this);
        values.reserve(model->headerItem->columnCount());
    }
}